

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cfftmi_(int *n,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  double *wa;
  double *in_RCX;
  double *in_RDX;
  long in_RSI;
  int *in_RDI;
  double dVar3;
  double dVar4;
  int iw1;
  
  wa = (double *)(in_RSI + -8);
  *(undefined4 *)in_RCX = 0;
  iVar1 = *(int *)in_RDX;
  iVar2 = *in_RDI;
  dVar3 = log((double)*in_RDI);
  dVar4 = log(2.0);
  if (iVar1 < iVar2 * 2 + (int)(dVar3 / dVar4) + 4) {
    *(undefined4 *)in_RCX = 2;
  }
  if (*in_RDI != 1) {
    mcfti1_(in_RDI,wa,in_RDX,in_RCX);
  }
  return 0;
}

Assistant:

int cfftmi_(int *n, fft_real_t *wsave, int *lensav,
	int *ier)
{
    /* Builtin functions */


    /* Local variables */
     int iw1;
    extern /* Subroutine */ int mcfti1_(int *, fft_real_t *, fft_real_t *, fft_real_t *),
	    xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0)) + 4) {
	*ier = 2;
	//xerfft_("CFFTMI ", &c__3, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    mcfti1_(n, &wsave[1], &wsave[iw1], &wsave[iw1 + 1]);
    return 0;
}